

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void print_usage(void)

{
  printf("-------------------------------\n");
  printf("manifold_test specific options:\n");
  printf("  -h: Print this message\n");
  printf("  -e: Export GLB models of samples\n");
  printf("  -c: Enable self-intersection checks (needs MANIFOLD_DEBUG)\n");
  printf("  -v: Enable verbose output (only works if compiled with MANIFOLD_DEBUG flag)\n");
  printf(
        "  -vv: Enable extra verbose output for triangulator (only works if compiled with MANIFOLD_DEBUG flag)\n"
        );
  return;
}

Assistant:

void print_usage() {
  printf("-------------------------------\n");
  printf("manifold_test specific options:\n");
  printf("  -h: Print this message\n");
  printf("  -e: Export GLB models of samples\n");
  printf("  -c: Enable self-intersection checks (needs MANIFOLD_DEBUG)\n");
  printf(
      "  -v: Enable verbose output (only works if compiled with MANIFOLD_DEBUG "
      "flag)\n");
  printf(
      "  -vv: Enable extra verbose output for triangulator (only works if "
      "compiled with MANIFOLD_DEBUG flag)\n");
}